

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O2

void h264e_dpb_dump_listX(H264eDpbFrm **list,RK_S32 count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = 0;
  }
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    uVar1 = (list[uVar6]->status).val;
    if ((uVar1 & 0x10) == 0) {
      uVar2 = uVar1 & 0x40;
      pcVar4 = "p";
      if (uVar2 == 0) {
        pcVar4 = "P";
      }
    }
    else {
      pcVar4 = "I";
      if ((uVar1 & 0x20) == 0) {
        pcVar4 = "i";
      }
      uVar2 = (ulong)((uint)uVar1 & 0x40);
    }
    pcVar5 = "lt";
    if (-1 < (char)uVar1) {
      pcVar5 = "st";
    }
    if (uVar2 != 0) {
      pcVar5 = "non";
    }
    _mpp_log_l(4,"h264e_dpb","frm  %2d   %d  %-3d %s    %-3d %-3s %-3d %-4x %-3d\n",
               "h264e_dpb_dump_listX",uVar6 & 0xffffffff,(ulong)(list[uVar6]->field_2).on_used,
               uVar1 >> 0x30,pcVar4,(ulong)((uint)(uVar1 >> 0xc) & 0xf),pcVar5,
               (ulong)((uint)(uVar1 >> 8) & 0xf),(ulong)((uint)(uVar1 >> 0x10) & 0x3f),
               (ulong)(uint)(int)(char)((uint)uVar1 >> 0x16));
  }
  return;
}

Assistant:

void h264e_dpb_dump_listX(H264eDpbFrm **list, RK_S32 count)
{
    RK_S32 i;

    for (i = 0; i < count; i++) {
        H264eDpbFrm *frm = list[i];
        EncFrmStatus *status = &frm->status;

        mpp_log_f("frm  %2d   %d  %-3d %s    %-3d %-3s %-3d %-4x %-3d\n",
                  i, frm->on_used, status->seq_idx,
                  (status->is_intra) ? (status->is_idr ? "I" : "i" ) :
                      status->is_non_ref ? "p" : "P",
                      status->temporal_id,
                      status->is_non_ref ? "non" : status->is_lt_ref ? "lt" : "st",
                      status->lt_idx,
                      status->ref_mode,
                      status->ref_arg);
    }
}